

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

void __thiscall chrono::ChAssembly::~ChAssembly(ChAssembly *this)

{
  ~ChAssembly(this);
  ::operator_delete(this,0x150);
  return;
}

Assistant:

ChAssembly::~ChAssembly() {
    RemoveAllBodies();
    RemoveAllShafts();
    RemoveAllLinks();
    RemoveAllMeshes();
    RemoveAllOtherPhysicsItems();
}